

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaExporter.cpp
# Opt level: O0

void __thiscall Assimp::ColladaExporter::WriteAnimationsLibrary(ColladaExporter *this)

{
  char *pcVar1;
  ostream *poVar2;
  ulong local_70;
  size_t a;
  allocator local_51;
  string local_50;
  undefined1 local_30 [8];
  string scene_name_escaped;
  ColladaExporter *this_local;
  
  scene_name_escaped.field_2._8_8_ = this;
  pcVar1 = aiString::C_Str(&this->mScene->mRootNode->mName);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_50,pcVar1,&local_51);
  XMLEscape((string *)local_30,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  if (this->mScene->mNumAnimations != 0) {
    poVar2 = std::operator<<((ostream *)&this->field_0x38,(string *)&this->startstr);
    poVar2 = std::operator<<(poVar2,"<library_animations>");
    std::operator<<(poVar2,(string *)&this->endstr);
    PushTag(this);
    for (local_70 = 0; local_70 < this->mScene->mNumAnimations; local_70 = local_70 + 1) {
      WriteAnimationLibrary(this,local_70);
    }
    PopTag(this);
    poVar2 = std::operator<<((ostream *)&this->field_0x38,(string *)&this->startstr);
    poVar2 = std::operator<<(poVar2,"</library_animations>");
    std::operator<<(poVar2,(string *)&this->endstr);
  }
  std::__cxx11::string::~string((string *)local_30);
  return;
}

Assistant:

void ColladaExporter::WriteAnimationsLibrary()
{
	const std::string scene_name_escaped = XMLEscape(mScene->mRootNode->mName.C_Str());
	
	if ( mScene->mNumAnimations > 0 ) {
		mOutput << startstr << "<library_animations>" << endstr;
		PushTag();
		
		// start recursive write at the root node
		for( size_t a = 0; a < mScene->mNumAnimations; ++a)
			WriteAnimationLibrary( a );

		PopTag();
		mOutput << startstr << "</library_animations>" << endstr;
	}
}